

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

CopyOrMove * __thiscall
kj::_::NullableValue<kj::(anonymous_namespace)::CopyOrMove>::
emplace<kj::(anonymous_namespace)::CopyOrMove&>
          (NullableValue<kj::(anonymous_namespace)::CopyOrMove> *this,CopyOrMove *params)

{
  CopyOrMove *params_00;
  CopyOrMove *params_local;
  NullableValue<kj::(anonymous_namespace)::CopyOrMove> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::(anonymous_namespace)::CopyOrMove>(&(this->field_1).value);
  }
  params_00 = fwd<kj::(anonymous_namespace)::CopyOrMove&>(params);
  ctor<kj::(anonymous_namespace)::CopyOrMove,kj::(anonymous_namespace)::CopyOrMove&>
            (&(this->field_1).value,params_00);
  this->isSet = true;
  return (CopyOrMove *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }